

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O1

DS_STATUS ds_entry_remove(DsListEntry **entryAdd)

{
  DsListEntry *__ptr;
  DS_STATUS DVar1;
  DsListEntry **ppDVar2;
  
  DVar1 = DS_STATUS_NULL;
  if ((entryAdd != (DsListEntry **)0x0) && (__ptr = *entryAdd, __ptr != (DsListEntry *)0x0)) {
    if ((__ptr->next == (DsListEntry *)0x0) && (__ptr->prev == (DsListEntry *)0x0)) {
      *entryAdd = (DsListEntry *)0x0;
    }
    else {
      ppDVar2 = &__ptr->prev->next;
      if (__ptr->prev == (DsListEntry *)0x0) {
        ppDVar2 = entryAdd;
      }
      *ppDVar2 = __ptr->next;
      if (__ptr->next != (DsListEntry *)0x0) {
        __ptr->next->prev = __ptr->prev;
      }
    }
    free(__ptr);
    DVar1 = DS_STATUS_OK;
  }
  return DVar1;
}

Assistant:

static DS_STATUS ds_entry_remove(DsListEntry **entryAdd)
{
    if (NULL == entryAdd || NULL == *entryAdd)
        return DS_STATUS_NULL;
    DsListEntry *entry = *entryAdd;
    if (NULL == entry->next && NULL == entry->prev)
        *entryAdd = NULL;
    else
    {
        if (entry->prev)
            entry->prev->next = entry->next;
        else
            *entryAdd = entry->next;

        if (entry->next)
            entry->next->prev = entry->prev;
    }
    free(entry);
    return DS_STATUS_OK;
}